

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O1

void Gia_ManBuiltInSimResimulate(Gia_Man_t *p)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  
  if (0 < p->nObjs) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      uVar1 = *(uint *)(&p->pObjs->field_0x0 + lVar3);
      if ((~uVar1 & 0x1fffffff) != 0 && -1 < (int)uVar1) {
        Gia_ManBuiltInSimPerformInt(p,(int)lVar2);
      }
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0xc;
    } while (lVar2 < p->nObjs);
  }
  return;
}

Assistant:

void Gia_ManBuiltInSimResimulate( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;  int iObj;
    Gia_ManForEachAnd( p, pObj, iObj )
        Gia_ManBuiltInSimPerformInt( p, iObj );
}